

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<long,unsigned_short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  bool bVar1;
  uint in_stack_ffffffffffffffa8;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffb0;
  
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_ffffffffffffffb0.m_int,
             (int *)CONCAT17(in_stack_ffffffffffffffaf,
                             CONCAT16(in_stack_ffffffffffffffae,
                                      CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
                            ));
  bVar1 = ::operator!=(CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae),
                       in_stack_ffffffffffffffb0);
  uVar2 = in_stack_ffffffffffffffa8 & 0xffffff;
  uVar4 = uVar2;
  if (bVar1) {
    SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffb0.m_int,
               (int *)(CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8))) & 0xffffffff00ffffff)
              );
    bVar1 = ::operator!=(in_stack_ffffffffffffffb0,
                         CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae));
    uVar3 = uVar2 & 0xffffff;
    uVar4 = uVar3;
    if (bVar1) {
      SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 in_stack_ffffffffffffffb0.m_int,
                 (int *)(CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT24(in_stack_ffffffffffffffac,uVar2))) &
                        0xffffffff00ffffff));
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 in_stack_ffffffffffffffb0.m_int,
                 (int *)CONCAT17(in_stack_ffffffffffffffaf,
                                 CONCAT16(in_stack_ffffffffffffffae,
                                          CONCAT24(in_stack_ffffffffffffffac,uVar3))));
      rhs.m_int._1_1_ = in_stack_ffffffffffffffaf;
      rhs.m_int._0_1_ = in_stack_ffffffffffffffae;
      bVar1 = ::operator!=(in_stack_ffffffffffffffb0,rhs);
      uVar2 = uVar3 & 0xffffff;
      uVar4 = uVar2;
      if (bVar1) {
        SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                   in_stack_ffffffffffffffb0.m_int,
                   (int *)(CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT24(in_stack_ffffffffffffffac,uVar3))) &
                          0xffffffff00ffffff));
        bVar1 = ::operator!=((bool)in_stack_ffffffffffffffaf,in_stack_ffffffffffffffb0);
        uVar4 = 0;
        if (bVar1) {
          bVar1 = false;
          SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    ((SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     in_stack_ffffffffffffffb0.m_int,(int *)((ulong)uVar2 & 0xffffffff00ffffff));
          bVar1 = ::operator!=(bVar1,in_stack_ffffffffffffffb0);
          uVar4 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}